

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O0

int __thiscall CVmFormatter::parse_color_attr(CVmFormatter *this,wchar_t *val,os_color_t *result)

{
  int iVar1;
  ulong *in_RDX;
  int *in_RSI;
  bool bVar2;
  wchar_t *in_stack_00000010;
  unsigned_long hexval;
  color_tbl_t *p;
  int local_3c;
  int local_38;
  ulong local_30;
  color_tbl_t *local_28;
  int *local_18;
  int local_4;
  
  if (*in_RSI == 0x23) {
    local_30 = 0;
    local_18 = in_RSI + 1;
    while( true ) {
      bVar2 = false;
      if (*local_18 != 0) {
        iVar1 = is_xdigit(L'\0');
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      iVar1 = t3_is_digit(L'\0');
      if (iVar1 == 0) {
        if ((*local_18 < 0x61) || (0x66 < *local_18)) {
          local_3c = *local_18 + -0x37;
        }
        else {
          local_3c = *local_18 + -0x57;
        }
        local_38 = local_3c;
      }
      else {
        local_38 = *local_18 + -0x30;
      }
      local_30 = (long)local_38 + local_30 * 0x10;
      local_18 = local_18 + 1;
    }
    *in_RDX = local_30 & 0xffffff;
    local_4 = 1;
  }
  else {
    for (local_28 = color_tbl; local_28->name != (wchar_t *)0x0; local_28 = local_28 + 1) {
      iVar1 = CVmCaseFoldStr::wstreq((wchar_t *)hexval,in_stack_00000010);
      if (iVar1 != 0) {
        *in_RDX = local_28->color_code;
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVmFormatter::parse_color_attr(VMG_ const wchar_t *val,
                                   os_color_t *result)
{
    const color_tbl_t *p;

    /* 
     *   if the value starts with '#', it's a hex RGB value; otherwise, it's
     *   a color name 
     */
    if (*val == '#')
    {
        unsigned long hexval;

        /* parse the value as a hex number */
        for (hexval = 0, ++val ; *val != '\0' && is_xdigit(*val) ; ++val)
        {
            /* add this digit */
            hexval <<= 4;
            hexval += (t3_is_digit(*val)
                       ? *val - '0'
                       : *val >= 'a' && *val <= 'f'
                       ? *val - 'a' + 0x0A
                       : *val - 'A' + 0x0A);
        }

        /* 
         *   os_color_t uses the same encoding as HTML, so just return the
         *   value as given (ensuring that it doesn't overflow the 24 bits
         *   assigned to our RGB encoding) 
         */
        *result = (os_color_t)(hexval & 0x00FFFFFF);
        return TRUE;
    }
    else
    {
        /* scan the color table for a match for the name */
        for (p = color_tbl ; p->name != 0 ; ++p)
        {
            /* if the name matches, use it */
            if (CVmCaseFoldStr::wstreq(val, p->name))
            {
                /* this is the color - make it the current buffer color */
                *result = p->color_code;

                /* indicate that we found a valid color value */
                return TRUE;
            }
        }
    }

    /* indicate that we didn't find a valid color value */
    return FALSE;
}